

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  lua_CFunction p_Var1;
  StkId pTVar2;
  Proto *p;
  bool bVar3;
  int lastpc;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char *name;
  char *local_28;
  
  local_28 = (char *)0x0;
  ci = L->ci;
  if ((ci->callstatus & 2) != 0) {
    if (ci->func->tt_ != 0x8006) {
      pcVar4 = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_00129fc7:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x25c,"const char *getupvalname(CallInfo *, const TValue *, const char **)");
    }
    p_Var1 = (ci->func->value_).f;
    if (p_Var1[8] != (_func_int_lua_State_ptr)0x6) {
      pcVar4 = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
      goto LAB_00129fc7;
    }
    bVar3 = true;
    pcVar4 = (char *)0x0;
    if ((ulong)(byte)p_Var1[10] != 0) {
      uVar6 = 0;
      do {
        if ((TValue *)**(long **)(p_Var1 + uVar6 * 8 + 0x20) == o) {
          local_28 = upvalname(*(Proto **)(p_Var1 + 0x18),(int)uVar6);
          pcVar4 = "upvalue";
          bVar3 = false;
          break;
        }
        uVar6 = uVar6 + 1;
      } while ((byte)p_Var1[10] != uVar6);
    }
    if (!bVar3) goto LAB_00129f7f;
    pTVar2 = (ci->u).l.base;
    lVar5 = (long)o - (long)pTVar2;
    if ((-1 < lVar5) && (lVar5 < (long)ci->top - (long)pTVar2)) {
      if (ci->func->tt_ == 0x8006) {
        p_Var1 = (ci->func->value_).f;
        if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
          p = *(Proto **)(p_Var1 + 0x18);
          lastpc = currentpc(ci);
          pcVar4 = getobjname(p,lastpc,(int)((ulong)((long)o - (long)(ci->u).l.base) >> 4),&local_28
                             );
          goto LAB_00129f7f;
        }
        pcVar4 = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
      }
      else {
        pcVar4 = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x26f,"const char *varinfo(lua_State *, const TValue *)");
    }
  }
  pcVar4 = (char *)0x0;
LAB_00129f7f:
  if (pcVar4 == (char *)0x0) {
    return "";
  }
  pcVar4 = luaO_pushfstring(L," (%s \'%s\')",pcVar4,local_28);
  return pcVar4;
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  const char *name = NULL;  /* to avoid warnings */
  CallInfo *ci = L->ci;
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind && isinstack(ci, o))  /* no? try a register */
      kind = getobjname(ci_func(ci)->p, currentpc(ci),
                        cast_int(o - ci->u.l.base), &name);
  }
  return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}